

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

void __thiscall GYMPlayer::CalcSongLength(GYMPlayer *this)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  uint local_14;
  UINT8 curCmd;
  bool fileEnd;
  UINT32 filePos;
  GYMPlayer *this_local;
  
  this->_totalTicks = 0;
  this->_loopOfs = 0;
  bVar1 = false;
  local_14 = (this->_fileHdr).dataOfs;
  while( true ) {
    bVar3 = false;
    if (!bVar1) {
      bVar3 = local_14 < this->_fileLen;
    }
    if (!bVar3) break;
    if ((this->_totalTicks == (this->_fileHdr).loopFrame) && ((this->_fileHdr).loopFrame != 0)) {
      this->_loopOfs = local_14;
    }
    uVar2 = (uint)this->_fileData[local_14];
    if (uVar2 == 0) {
      this->_totalTicks = this->_totalTicks + 1;
      local_14 = local_14 + 1;
    }
    else if (uVar2 - 1 < 2) {
      local_14 = local_14 + 3;
    }
    else if (uVar2 == 3) {
      local_14 = local_14 + 2;
    }
    else {
      bVar1 = true;
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void GYMPlayer::CalcSongLength(void)
{
	UINT32 filePos;
	bool fileEnd;
	UINT8 curCmd;
	
	_totalTicks = 0;
	_loopOfs = 0;
	
	fileEnd = false;
	filePos = _fileHdr.dataOfs;
	while(! fileEnd && filePos < _fileLen)
	{
		if (_totalTicks == _fileHdr.loopFrame && _fileHdr.loopFrame != 0)
			_loopOfs = filePos;
		
		curCmd = _fileData[filePos];
		filePos ++;
		switch(curCmd)
		{
		case 0x00:	// wait 1 frame
			_totalTicks ++;
			break;
		case 0x01:
		case 0x02:
			filePos += 0x02;
			break;
		case 0x03:
			filePos += 0x01;
			break;
		default:
			fileEnd = true;
			break;
		}
	}
	
	return;
}